

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O1

void __thiscall
glcts::TestConfiguration<unsigned_short,_unsigned_char>::TestConfiguration
          (TestConfiguration<unsigned_short,_unsigned_char> *this,
          TestConfiguration<unsigned_short,_unsigned_char> *configuration)

{
  this->_vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_02155528;
  this->m_n_in_components = configuration->m_n_in_components;
  this->m_n_out_components = configuration->m_n_out_components;
  this->m_target = configuration->m_target;
  this->m_input_internal_format = configuration->m_input_internal_format;
  this->m_output_internal_format = configuration->m_output_internal_format;
  this->m_filtering = configuration->m_filtering;
  this->m_input_format = configuration->m_input_format;
  this->m_output_format = configuration->m_output_format;
  this->m_width = configuration->m_width;
  this->m_height = configuration->m_height;
  this->m_depth = configuration->m_depth;
  this->m_init_value = configuration->m_init_value;
  this->m_init_border_color = configuration->m_init_border_color;
  this->m_expected_value = configuration->m_expected_value;
  this->m_expected_border_color = configuration->m_expected_border_color;
  this->m_input_type = configuration->m_input_type;
  this->m_output_type = configuration->m_output_type;
  return;
}

Assistant:

TestConfiguration<InputType, OutputType>::TestConfiguration(const TestConfiguration& configuration)
{
	m_n_in_components		 = configuration.get_n_in_components();
	m_n_out_components		 = configuration.get_n_out_components();
	m_target				 = configuration.get_target();
	m_input_internal_format  = configuration.get_input_internal_format();
	m_output_internal_format = configuration.get_output_internal_format();
	m_filtering				 = configuration.get_filtering();
	m_input_format			 = configuration.get_input_format();
	m_output_format			 = configuration.get_output_format();
	m_width					 = configuration.get_width();
	m_height				 = configuration.get_height();
	m_depth					 = configuration.get_depth();
	m_init_value			 = configuration.get_init_value();
	m_init_border_color		 = configuration.get_init_border_color();
	m_expected_value		 = configuration.get_expected_value();
	m_expected_border_color  = configuration.get_expected_border_color();
	m_input_type			 = configuration.get_input_type();
	m_output_type			 = configuration.get_output_type();
}